

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O0

void __thiscall
FIX::SocketAcceptor::onConfigure(SocketAcceptor *this,SessionSettings *sessionSettings)

{
  bool bVar1;
  Dictionary *pDVar2;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  Dictionary *local_70;
  Dictionary *settings;
  SessionID *sessionID;
  iterator __end1;
  iterator __begin1;
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *__range1;
  SessionSettings *sessionSettings_local;
  SocketAcceptor *this_local;
  
  SessionSettings::getSessions
            ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
             &__begin1,sessionSettings);
  __end1 = std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::
           begin((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
                 &__begin1);
  sessionID = (SessionID *)
              std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::
              end((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *
                  )&__begin1);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&sessionID), bVar1) {
    settings = (Dictionary *)std::_Rb_tree_const_iterator<FIX::SessionID>::operator*(&__end1);
    pDVar2 = SessionSettings::get(sessionSettings,(SessionID *)settings);
    local_70 = pDVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"SocketAcceptPort",&local_a1);
    Dictionary::getInt(pDVar2,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    pDVar2 = local_70;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"SocketReuseAddress",&local_c9);
    bVar1 = Dictionary::has(pDVar2,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    pDVar2 = local_70;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"SocketReuseAddress",&local_f1);
      Dictionary::getBool(pDVar2,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
    }
    pDVar2 = local_70;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"SocketNodelay",&local_119);
    bVar1 = Dictionary::has(pDVar2,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    pDVar2 = local_70;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"SocketNodelay",&local_141);
      Dictionary::getBool(pDVar2,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
    }
    std::_Rb_tree_const_iterator<FIX::SessionID>::operator++(&__end1);
  }
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::~set
            ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
             &__begin1);
  return;
}

Assistant:

EXCEPT(ConfigError) {
  for (const SessionID &sessionID : sessionSettings.getSessions()) {
    const Dictionary &settings = sessionSettings.get(sessionID);
    settings.getInt(SOCKET_ACCEPT_PORT);
    if (settings.has(SOCKET_REUSE_ADDRESS)) {
      settings.getBool(SOCKET_REUSE_ADDRESS);
    }
    if (settings.has(SOCKET_NODELAY)) {
      settings.getBool(SOCKET_NODELAY);
    }
  }
}